

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int match_class(int c,int cl)

{
  int iVar1;
  uint uVar2;
  ushort **ppuVar3;
  uint uVar4;
  
  iVar1 = tolower(cl);
  if (iVar1 < 0x6c) {
    if (iVar1 == 0x61) {
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 0x400;
    }
    else if (iVar1 == 99) {
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 2;
    }
    else {
      if (iVar1 != 100) goto switchD_00112ff8_caseD_6d;
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 0x800;
    }
  }
  else {
    switch(iVar1) {
    case 0x6c:
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 0x200;
      break;
    default:
switchD_00112ff8_caseD_6d:
      return (uint)(cl == c);
    case 0x70:
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 4;
      break;
    case 0x73:
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 0x2000;
      break;
    case 0x75:
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 0x100;
      break;
    case 0x77:
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 8;
      break;
    case 0x78:
      ppuVar3 = __ctype_b_loc();
      uVar4 = (*ppuVar3)[(uint)c] & 0x1000;
      break;
    case 0x7a:
      uVar4 = (uint)(c == 0);
    }
  }
  ppuVar3 = __ctype_b_loc();
  uVar2 = (uint)(uVar4 == 0);
  if ((*(byte *)((long)*ppuVar3 + (ulong)(uint)cl * 2 + 1) & 2) != 0) {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

static int match_class(int c,int cl){
int res;
switch(tolower(cl)){
case'a':res=isalpha(c);break;
case'c':res=iscntrl(c);break;
case'd':res=isdigit(c);break;
case'l':res=islower(c);break;
case'p':res=ispunct(c);break;
case's':res=isspace(c);break;
case'u':res=isupper(c);break;
case'w':res=isalnum(c);break;
case'x':res=isxdigit(c);break;
case'z':res=(c==0);break;
default:return(cl==c);
}
return(islower(cl)?res:!res);
}